

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

void __thiscall
Units_isEquivalentBaseUnitNotInModel_Test::TestBody(Units_isEquivalentBaseUnitNotInModel_Test *this)

{
  string *psVar1;
  char cVar2;
  AssertionResult gtest_ar_;
  UnitsPtr u2;
  UnitsPtr u1;
  ModelPtr model;
  UnitsPtr u;
  AssertionResult local_a8;
  long local_98 [2];
  long *local_88;
  AssertHelper local_80 [8];
  long *local_78;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  long local_68 [2];
  string *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  string *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  string *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  string *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  libcellml::Model::create();
  psVar1 = local_38;
  local_a8._0_8_ = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"model","");
  libcellml::NamedEntity::setName(psVar1);
  if ((long *)local_a8._0_8_ != local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  libcellml::Units::create();
  psVar1 = local_28;
  local_a8._0_8_ = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"u","");
  libcellml::NamedEntity::setName(psVar1);
  if ((long *)local_a8._0_8_ != local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  local_a8._0_8_ = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"apples","");
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
  libcellml::Units::addUnit(local_28,(int)&local_a8,1.0,1.0,(string *)0x0);
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  if ((long *)local_a8._0_8_ != local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  libcellml::Units::create();
  psVar1 = local_48;
  local_a8._0_8_ = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"u1","");
  libcellml::NamedEntity::setName(psVar1);
  if ((long *)local_a8._0_8_ != local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  local_a8._0_8_ = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"");
  libcellml::Units::addUnit((StandardUnit)local_48,0x16,1.0,1.0,(string *)0x0);
  if ((long *)local_a8._0_8_ != local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  libcellml::Units::create();
  psVar1 = local_58;
  local_a8._0_8_ = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"u2","");
  libcellml::NamedEntity::setName(psVar1);
  if ((long *)local_a8._0_8_ != local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  psVar1 = local_58;
  local_a8._0_8_ = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"");
  libcellml::Units::addUnit((StandardUnit)psVar1,0x16,1.0,1.0,(string *)0x0);
  if ((long *)local_a8._0_8_ != local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  local_a8._0_8_ = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"u","");
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
  libcellml::Units::addUnit(local_58,(int)&local_a8,1.0,1.0,(string *)0x0);
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  if ((long *)local_a8._0_8_ != local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  libcellml::Model::addUnits((shared_ptr *)local_38);
  libcellml::Model::addUnits((shared_ptr *)local_38);
  cVar2 = libcellml::Units::compatible((shared_ptr *)&local_48,(shared_ptr *)&local_58);
  local_78 = (long *)(CONCAT71(local_78._1_7_,cVar2) ^ 1);
  local_70.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar2 != '\0') {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(char *)&local_78,"libcellml::Units::compatible(u1, u2)","true");
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x799,(char *)local_a8._0_8_);
    testing::internal::AssertHelper::operator=(local_80,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    if ((long *)local_a8._0_8_ != local_98) {
      operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
    }
    if (local_88 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_88 != (long *)0x0)) {
        (**(code **)(*local_88 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cVar2 = libcellml::Units::compatible((shared_ptr *)&local_58,(shared_ptr *)&local_48);
  local_78 = (long *)(CONCAT71(local_78._1_7_,cVar2) ^ 1);
  local_70.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar2 != '\0') {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(char *)&local_78,"libcellml::Units::compatible(u2, u1)","true");
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x79a,(char *)local_a8._0_8_);
    testing::internal::AssertHelper::operator=(local_80,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    if ((long *)local_a8._0_8_ != local_98) {
      operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
    }
    if (local_88 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_88 != (long *)0x0)) {
        (**(code **)(*local_88 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  return;
}

Assistant:

TEST(Units, isEquivalentBaseUnitNotInModel)
{
    libcellml::ModelPtr model = libcellml::Model::create();
    model->setName("model");

    libcellml::UnitsPtr u = libcellml::Units::create();
    u->setName("u");
    u->addUnit("apples", 0, 1.0, 1.0);

    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("u1");
    u1->addUnit(libcellml::Units::StandardUnit::RADIAN, 0, 1.0, 1.0);

    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("u2");
    u2->addUnit(libcellml::Units::StandardUnit::RADIAN, 0, 1.0, 1.0);
    u2->addUnit("u", 0, 1.0, 1.0);
    // u1 compatible to u2 test should fail because base unit "u" is not present in u1, regardless of whether "apples" exists or not

    model->addUnits(u1);
    model->addUnits(u2);

    // Units "u" not in model.  Units "apples" doesn't exist.  Units are not linked.
    EXPECT_FALSE(libcellml::Units::compatible(u1, u2));
    EXPECT_FALSE(libcellml::Units::compatible(u2, u1));
}